

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::js::anon_unknown_0::FileDeduplicator::AddFile
          (FileDeduplicator *this,string *filename,void *desc,string *error)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_void_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_void_*>_>_>
  *this_00;
  mapped_type pvVar1;
  iterator iVar2;
  long *plVar3;
  mapped_type *ppvVar4;
  long *plVar5;
  pair<std::_Rb_tree_iterator<const_void_*>,_std::_Rb_tree_iterator<const_void_*>_> pVar6;
  mapped_type local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  long *local_48;
  long local_40;
  long local_38;
  long lStack_30;
  
  this_00 = &this->descs_by_filename_;
  local_70 = desc;
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_void_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_void_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_void_*>_>_>
          ::find(&this_00->_M_t,filename);
  if ((_Rb_tree_header *)iVar2._M_node !=
      &(this->descs_by_filename_)._M_t._M_impl.super__Rb_tree_header) {
    if (this->error_on_conflict_ == true) {
      std::operator+(&local_68,"Name conflict: file name ",filename);
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_68);
      plVar5 = plVar3 + 2;
      if ((long *)*plVar3 == plVar5) {
        local_38 = *plVar5;
        lStack_30 = plVar3[3];
        local_48 = &local_38;
      }
      else {
        local_38 = *plVar5;
        local_48 = (long *)*plVar3;
      }
      local_40 = plVar3[1];
      *plVar3 = (long)plVar5;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      std::__cxx11::string::operator=((string *)error,(string *)&local_48);
      if (local_48 != &local_38) {
        operator_delete(local_48,local_38 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      return false;
    }
    ppvVar4 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_void_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_void_*>_>_>
              ::operator[](this_00,filename);
    pVar6 = std::
            _Rb_tree<const_void_*,_const_void_*,_std::_Identity<const_void_*>,_std::less<const_void_*>,_std::allocator<const_void_*>_>
            ::equal_range(&(this->allowed_descs_)._M_t,ppvVar4);
    std::
    _Rb_tree<const_void_*,_const_void_*,_std::_Identity<const_void_*>,_std::less<const_void_*>,_std::allocator<const_void_*>_>
    ::_M_erase_aux(&(this->allowed_descs_)._M_t,(_Base_ptr)pVar6.first._M_node,
                   (_Base_ptr)pVar6.second._M_node);
  }
  pvVar1 = local_70;
  ppvVar4 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_void_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_void_*>_>_>
            ::operator[](this_00,filename);
  *ppvVar4 = pvVar1;
  std::
  _Rb_tree<void_const*,void_const*,std::_Identity<void_const*>,std::less<void_const*>,std::allocator<void_const*>>
  ::_M_insert_unique<void_const*const&>
            ((_Rb_tree<void_const*,void_const*,std::_Identity<void_const*>,std::less<void_const*>,std::allocator<void_const*>>
              *)&this->allowed_descs_,&local_70);
  return true;
}

Assistant:

bool AddFile(const string& filename, const void* desc, string* error) {
    if (descs_by_filename_.find(filename) != descs_by_filename_.end()) {
      if (error_on_conflict_) {
        *error = "Name conflict: file name " + filename +
                 " would be generated by two descriptors";
        return false;
      }
      allowed_descs_.erase(descs_by_filename_[filename]);
    }

    descs_by_filename_[filename] = desc;
    allowed_descs_.insert(desc);
    return true;
  }